

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void selection_changed(Fl_Type *p)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  
  if (((the_panel != (Fl_Window *)0x0 && p != (Fl_Type *)0x0) &&
      (((the_panel->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0)) &&
     (set_cb((Fl_Button *)p,(void *)CONCAT71(in_register_00000031,in_SIL)), haderror == '\x01')) {
    Fl_Type::current = (Fl_Type *)0x0;
    for (pFVar2 = Fl_Type::first; pFVar2 != (Fl_Type *)0x0; pFVar2 = pFVar2->next) {
      pFVar2->new_selected = pFVar2->selected;
      pFVar1 = (Fl_Type *)0x0;
      if (pFVar2->selected != '\0') {
        pFVar1 = pFVar2;
      }
      if (Fl_Type::current == (Fl_Type *)0x0) {
        Fl_Type::current = pFVar1;
      }
    }
    if (p->selected != '\0') {
      Fl_Type::current = p;
    }
    redraw_browser();
    return;
  }
  if (Fl_Type::first == (Fl_Type *)0x0) {
    pFVar2 = (Fl_Type *)0x0;
  }
  else {
    pFVar1 = Fl_Type::first;
    pFVar3 = (Fl_Type *)0x0;
    do {
      pFVar2 = (Fl_Type *)0x0;
      if (pFVar1->new_selected != '\0') {
        pFVar2 = pFVar1;
      }
      if (pFVar3 != (Fl_Type *)0x0) {
        pFVar2 = pFVar3;
      }
      pFVar1->selected = pFVar1->new_selected;
      pFVar1 = pFVar1->next;
      pFVar3 = pFVar2;
    } while (pFVar1 != (Fl_Type *)0x0);
  }
  if ((p == (Fl_Type *)0x0) || (Fl_Type::current = p, p->selected == '\0')) {
    Fl_Type::current = pFVar2;
  }
  check_redraw_corresponding_parent(Fl_Type::current);
  redraw_overlays();
  load_panel();
  update_sourceview_position();
  return;
}

Assistant:

void selection_changed(Fl_Type *p) {
  // store all changes to the current selected objects:
  if (p && the_panel && the_panel->visible()) {
    set_cb(0,0);
    // if there was an error, we try to leave the selected set unchanged:
    if (haderror) {
      Fl_Type *q = 0;
      for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
	o->new_selected = o->selected;
	if (!q && o->selected) q = o;
      }
      if (!p || !p->selected) p = q;
      Fl_Type::current = p;
      redraw_browser();
      return;
    }
  }
  // update the selected flags to new set:
  Fl_Type *q = 0;
  for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
    o->selected = o->new_selected;
    if (!q && o->selected) q = o;
  }
  if (!p || !p->selected) p = q;
  Fl_Type::current = p;
  check_redraw_corresponding_parent(p);
  redraw_overlays();
  // load the panel with the new settings:
  load_panel();
  // update the source viewer to show the code for the selected object
  update_sourceview_position();
}